

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O0

void MakeCmakeComment(string *cmakeComment,string *contents)

{
  long lVar1;
  ulong uVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t findPos;
  size_t lastPos;
  undefined8 local_18;
  
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_18 = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)in_RSI,10);
    if (lVar1 == -1) break;
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append(in_RDI,in_RSI,local_18);
    local_18 = lVar1 + 1;
  }
  uVar2 = std::__cxx11::string::size();
  if (local_18 < uVar2) {
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append(in_RDI,in_RSI,local_18);
    std::__cxx11::string::append((char *)in_RDI);
  }
  return;
}

Assistant:

void MakeCmakeComment(std::string& cmakeComment, const std::string& contents)
{
    cmakeComment.reserve(contents.size());
    size_t lastPos = 0, findPos;
    while ((findPos = contents.find('\n', lastPos)) != std::string::npos) {
        cmakeComment.append("# ");
        cmakeComment.append(contents, lastPos, findPos - lastPos + 1);
        lastPos = findPos + 1;
    }
    if (lastPos < contents.size()) {
        cmakeComment.append("# ");
        cmakeComment.append(contents, lastPos, std::string::npos);
        cmakeComment.append("\n");
    }
}